

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeEstimatorUtils.cpp
# Opt level: O0

bool checkValidMeasurement(Vector3 *in,string *measurement_type,bool check_also_zero_vector)

{
  bool bVar1;
  char *pcVar2;
  byte in_DL;
  Vector3 *in_stack_ffffffffffffff88;
  string local_70 [16];
  char *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  string local_40 [39];
  byte local_19;
  bool local_1;
  
  local_19 = in_DL & 1;
  if ((local_19 == 0) || (bVar1 = isZeroVector(in_stack_ffffffffffffff88), !bVar1)) {
    bVar1 = isVectorNaN(in_stack_ffffffffffffff88);
    if (bVar1) {
      std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("AttitudeEstimator","checkValidMeasurement",pcVar2);
      std::__cxx11::string::~string(local_70);
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iDynTree::reportError("AttitudeEstimator","checkValidMeasurement",pcVar2);
    std::__cxx11::string::~string(local_40);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool checkValidMeasurement(const iDynTree::Vector3& in, const std::string& measurement_type, bool check_also_zero_vector)
{
    if (check_also_zero_vector)
    {
        if (isZeroVector(in))
        {
            iDynTree::reportError("AttitudeEstimator", "checkValidMeasurement",
                                  (measurement_type + " measurements are invalid. Expecting a non-zero vector.").c_str());
            return false;
        }
    }

    if (isVectorNaN(in))
    {
        iDynTree::reportError("AttitudeEstimator", "checkValidMeasurement",
                              (measurement_type + " measurements are invalid. Has NaN elements.").c_str());
        return false;
    }

    return true;
}